

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostzposix.c
# Opt level: O0

int os_get_zoneinfo_key(char *buf,size_t buflen)

{
  int iVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char *zi;
  char linkbuf [4096];
  unsigned_long mode;
  char *z_3;
  char *p_1;
  char lbuf_1 [256];
  int ok_1;
  char *z_2;
  size_t l;
  int ok;
  char lbuf [256];
  FILE *fp;
  char fbuf [4096];
  char **dir;
  char *z_1;
  char *z;
  char *p;
  int fmt_ok;
  char *tz;
  undefined5 in_stack_ffffffffffffdd58;
  undefined1 in_stack_ffffffffffffdd5d;
  undefined1 in_stack_ffffffffffffdd5e;
  undefined1 uVar4;
  char *in_stack_ffffffffffffdd60;
  size_t in_stack_ffffffffffffdd68;
  char *in_stack_ffffffffffffdd70;
  size_t in_stack_ffffffffffffdd78;
  char *in_stack_ffffffffffffdd80;
  unsigned_long *in_stack_ffffffffffffdd88;
  unsigned_long *in_stack_ffffffffffffdd90;
  int in_stack_ffffffffffffdd9c;
  char *in_stack_ffffffffffffdda0;
  void *in_stack_ffffffffffffdda8;
  void *in_stack_ffffffffffffddb0;
  size_t in_stack_ffffffffffffdde8;
  char *in_stack_ffffffffffffddf0;
  char *in_stack_ffffffffffffddf8;
  ulong local_1290;
  char *local_1280;
  char local_1278 [260];
  int local_1174;
  char *local_1170;
  size_t local_1168;
  undefined4 local_115c;
  char local_1158 [264];
  FILE *local_1050;
  char local_1048 [4096];
  char **local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  uint local_24;
  char *local_20;
  int local_4;
  
  local_20 = getenv("TZ");
  if ((local_20 != (char *)0x0) && (*local_20 != '\0')) {
    local_24 = 1;
    uVar4 = true;
    if (*local_20 != ':') {
      ppuVar2 = __ctype_b_loc();
      in_stack_ffffffffffffdd5e = true;
      uVar4 = in_stack_ffffffffffffdd5e;
      if ((((*ppuVar2)[(int)*local_20] & 0x400) == 0) &&
         (in_stack_ffffffffffffdd5e = true, uVar4 = in_stack_ffffffffffffdd5e, *local_20 != '/')) {
        in_stack_ffffffffffffdd5e = *local_20 == '_';
        uVar4 = in_stack_ffffffffffffdd5e;
      }
    }
    local_24 = (byte)uVar4 & local_24;
    local_30 = local_20;
    while (local_30 = local_30 + 1, *local_30 != '\0') {
      ppuVar2 = __ctype_b_loc();
      in_stack_ffffffffffffdd5d = true;
      if ((((*ppuVar2)[(int)*local_30] & 0x400) == 0) &&
         (in_stack_ffffffffffffdd5d = true, *local_30 != '/')) {
        in_stack_ffffffffffffdd5d = *local_30 == '_';
      }
      local_24 = (byte)in_stack_ffffffffffffdd5d & local_24;
    }
    if (local_24 != 0) {
      if (*local_20 == ':') {
        if (local_20[1] != '/') {
          safe_strcpy(in_stack_ffffffffffffdd80,in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70)
          ;
          return 1;
        }
        local_38 = strstr(local_20,"/zoneinfo/");
        if (local_38 != (char *)0x0) {
          safe_strcpy(in_stack_ffffffffffffdd80,in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70)
          ;
          return 1;
        }
        local_38 = (char *)0x0;
      }
      else if (*local_20 == '/') {
        local_40 = strstr(local_20,"/zoneinfo/");
        if (local_40 != (char *)0x0) {
          safe_strcpy(in_stack_ffffffffffffdd80,in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70)
          ;
          return 1;
        }
        local_40 = (char *)0x0;
      }
      else {
        for (local_48 = os_get_zoneinfo_key::dirs; *local_48 != (char *)0x0; local_48 = local_48 + 1
            ) {
          os_build_full_path(in_stack_ffffffffffffdd70,in_stack_ffffffffffffdd68,
                             in_stack_ffffffffffffdd60,
                             (char *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffdd5e,
                                                             CONCAT15(in_stack_ffffffffffffdd5d,
                                                                      in_stack_ffffffffffffdd58))));
          iVar1 = access(local_1048,0);
          if (iVar1 == 0) {
            safe_strcpy(in_stack_ffffffffffffdd80,in_stack_ffffffffffffdd78,
                        in_stack_ffffffffffffdd70);
            return 1;
          }
        }
      }
    }
  }
  local_1050 = fopen("/etc/timezone","r");
  if (local_1050 != (FILE *)0x0) {
    local_115c = 0;
    pcVar3 = fgets(local_1158,0x100,local_1050);
    if (pcVar3 != (char *)0x0) {
      local_1168 = strlen(local_1158);
      if ((local_1168 != 0) && (local_1158[local_1168 - 1] == '\n')) {
        local_1158[local_1168 - 1] = '\0';
      }
      if (local_1158[0] == '/') {
        local_1170 = strstr(local_1158,"/zoneinfo/");
        if (local_1170 != (char *)0x0) {
          safe_strcpy(in_stack_ffffffffffffdd80,in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70)
          ;
          local_115c = 1;
        }
      }
      else {
        safe_strcpy(in_stack_ffffffffffffdd80,in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70);
        local_115c = 1;
      }
    }
    fclose(local_1050);
    if (local_115c != 0) {
      return 1;
    }
  }
  local_1050 = fopen("/etc/sysconfig/clock","r");
  if (local_1050 != (FILE *)0x0) {
    local_1174 = 0;
    do {
      do {
        pcVar3 = fgets(local_1278,0x100,local_1050);
        if (pcVar3 == (char *)0x0) goto LAB_0023d52a;
        local_1280 = local_1278;
        while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*local_1280] & 0x2000) != 0) {
          local_1280 = local_1280 + 1;
        }
        iVar1 = memicmp(in_stack_ffffffffffffddb0,in_stack_ffffffffffffdda8,
                        (size_t)in_stack_ffffffffffffdda0);
      } while (iVar1 != 0);
      local_1280 = local_1280 + 4;
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*local_1280] & 0x2000) != 0) {
        local_1280 = local_1280 + 1;
      }
    } while (*local_1280 != '=');
    do {
      local_1280 = local_1280 + 1;
      ppuVar2 = __ctype_b_loc();
    } while (((*ppuVar2)[(int)*local_1280] & 0x2000) != 0);
    if (*local_1280 == '/') {
      pcVar3 = strstr(local_1280,"/zoneinfo/");
      if (pcVar3 != (char *)0x0) {
        safe_strcpy(in_stack_ffffffffffffdd80,in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70);
        local_1174 = 1;
      }
    }
    else {
      safe_strcpy(in_stack_ffffffffffffdd80,in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70);
      local_1174 = 1;
    }
LAB_0023d52a:
    fclose(local_1050);
    if (local_1174 != 0) {
      return 1;
    }
  }
  iVar1 = osfmode(in_stack_ffffffffffffdda0,in_stack_ffffffffffffdd9c,in_stack_ffffffffffffdd90,
                  in_stack_ffffffffffffdd88);
  if ((((iVar1 == 0) || ((local_1290 & 0xa000) == 0)) ||
      (iVar1 = os_resolve_symlink(in_stack_ffffffffffffddf8,in_stack_ffffffffffffddf0,
                                  in_stack_ffffffffffffdde8), iVar1 == 0)) ||
     (pcVar3 = strstr(&stack0xffffffffffffdd68,"/zoneinfo/"), pcVar3 == (char *)0x0)) {
    local_4 = 0;
  }
  else {
    safe_strcpy(in_stack_ffffffffffffdd80,in_stack_ffffffffffffdd78,in_stack_ffffffffffffdd70);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int
os_get_zoneinfo_key( char *buf, size_t buflen )
{
    /* First, try the TZ environment variable.  This is used on nearly
     * all Unix-alikes for a per-process timezone setting, although
     * it will only contain a zoneinfo key in newer versions.  There
     * are several possible formats for specifying a zoneinfo key:
     *
     *  TZ=/usr/share/zoneinfo/America/Los_Angeles
     *    - A full absolute path name to a tzinfo file.  We'll sense
     *      this by looking for "/zoneinfo/" in the string, and if we
     *      find it, we'll return the portion after /zoneinfo/.
     *
     *  TZ=America/Los_Angeles
     *    - Just the zoneinfo key, without a path.  If we find a string
     *      that contains all alphabetics, undersores, and slashes, and
     *      has at least one internal slash but doesn't start with a
     *      slash, we probably have a zoneinfo key.  We'll see if we
     *      can find a matching file in the usual zoneinfo database
     *      locations: /etc/zoneinfo, /usr/share/zoneinfo; if we can,
     *      we'll return the key name, otherwise we'll assume this
     *      isn't actually a zoneinfo key but just happens to look like
     *      one in terms of format.
     *
     *  TZ=:America/Los_Angeles
     *  TZ=:/etc/zoneinfo/America/Los_Angeles
     *    - POSIX systems generally use the ":" prefix to signify that
     *      this is a zoneinfo path rather than the old-style "EST5EDT"
     *      type of self-contained zone description.  If we see a colon
     *      prefix with a relative path (properly formed in terms of
     *      its character content), we'll simply assume this is a
     *      zoneinfo key without even checking for an existing file,
     *      since there's not much else it could be.  If we see an
     *      absolute path, we'll search it for /zoneinfo/ and return
     *      the portion after this, again without checking for an
     *      existing file.
     */
    const char *tz = getenv("TZ");
    if (tz != 0 && tz[0] != '\0')
    {
        /* check that the string is formatted like a zoneinfo key */
#define tzcharok(c) (isalpha(c) != 0 || (c) == '/' || (c) == '_')
        int fmt_ok = TRUE;
        const char *p;
        fmt_ok &= (tz[0] == ':' || tzcharok(tz[0]));
        for (p = tz + 1 ; *p != '\0' ; ++p)
            fmt_ok &= tzcharok(*p);

        /* proceed only if it has the right format */
        if (fmt_ok)
        {
            /* check for a leading ':', per POSIX */
            if (tz[0] == ':')
            {
                /* yes, we have a leading ':', so it's almost certainly
                 * a zoneinfo key; if it's an absolute path, find the
                 * part after /zoneinfo/
                 */
                if (tz[1] == '/')
                {
                    /* absolute form - look for /zoneinfo/ */
                    const char *z = strstr(tz, "/zoneinfo/");
                    if (z != 0)
                    {
                        /* found it - return the part after /zoneinfo/ */
                        safe_strcpy(buf, buflen, z + 10);
                        return TRUE;
                    }
                }
                else
                {
                    /* relative path - return as-is minus the colon */
                    safe_strcpy(buf, buflen, tz + 1);
                    return TRUE;
                }
            }
            else
            {
                /* There's no colon, so it *might* be a zoneinfo key.
                 * If it's an absolute path containing /zoneinfo/, it's
                 * a solid bet.  If it's a relative path, look to see
                 * if we can find a file in one of the usual zoneinfo
                 * database locations.
                 */
                if (tz[0] == '/')
                {
                    /* absolute path - check for /zoneinfo/ */
                    const char *z = strstr(tz, "/zoneinfo/");
                    if (z != 0)
                    {
                        /* found it - return the part after /zoneinfo/ */
                        safe_strcpy(buf, buflen, z + 10);
                        return TRUE;
                    }
                }
                else
                {
                    /* relative path - look for a tzinfo file in the
                     * usual locations
                     */
                    static const char *dirs[] = {
                        "/etc/zoneinfo",
                        "/usr/share/zoneinfo",
                        0
                    };
                    const char **dir;
                    for (dir = dirs ; *dir != 0 ; ++dir)
                    {
                        /* build this full path */
                        char fbuf[OSFNMAX];
                        os_build_full_path(fbuf, sizeof(fbuf), *dir, tz);

                        /* check for a file at this location */
                        if (!osfacc(fbuf))
                        {
                            /* got it - looks like a good zoneinfo key */
                            safe_strcpy(buf, buflen, tz);
                            return TRUE;
                        }
                    }
                }
            }
        }
    }

    /* No luck with TZ, so try the system-wide settings next.
     *
     * If a file called /etc/timezone exists, it's usually a one-line
     * text file containing the zoneinfo key.  Read and return its
     * contents.
     */
    FILE *fp;
    if ((fp = fopen("/etc/timezone", "r")) != 0)
    {
        /* read the one-liner */
        char lbuf[256];
        int ok = FALSE;
        if (fgets(lbuf, sizeof(lbuf), fp) != 0)
        {
            /* strip any trailing newline */
            size_t l = strlen(lbuf);
            if (l != 0 && lbuf[l-1] == '\n')
                lbuf[l-1] = '\0';

            /* if it's in absolute format, return the part after
             * /zoneinfo/; otherwise just return the string
             */
            if (lbuf[0] == '/')
            {
                /* absoltue path - find /zoneinfo/ */
                const char *z = strstr(lbuf, "/zoneinfo/");
                if (z != 0)
                {
                    safe_strcpy(buf, buflen, z + 10);
                    ok = TRUE;
                }
            }
            else
            {
                /* relative notation - return it as-is */
                safe_strcpy(buf, buflen, lbuf);
                ok = TRUE;
            }
        }

        /* we're done with the file */
        fclose(fp);

        /* if we got our result, return success */
        if (ok)
            return TRUE;
    }

    /* If /etc/sysconfig/clock exists, read it and look for a line
     * starting with ZONE=.  This contains the zoneinfo key.
     */
    if ((fp = fopen("/etc/sysconfig/clock", "r")) != 0)
    {
        /* scan the file for ZONE=... */
        int ok = FALSE;
        for (;;)
        {
            /* read the next line */
            char lbuf[256];
            if (fgets(lbuf, sizeof(lbuf), fp) == 0)
                break;

            /* skip leading spaces */
            const char *p;
            for (p = lbuf ; isspace(*p) ; ++p) ;

            /* check for ZONE */
            if (memicmp(p, "zone", 4) != 0)
                continue;

            /* skip spaces after ZONE */
            for (p += 4 ; isspace(*p) ; ++p) ;

            /* check for '=' */
            if (*p != '=')
                continue;

            /* skip spaces after the '=' */
            for (++p ; isspace(*p) ; ++p) ;

            /* if it's in absolute form, look for /zoneinfo/ */
            if (*p == '/')
            {
                const char *z = strstr(p, "/zoneinfo/");
                if (z != 0)
                {
                    safe_strcpy(buf, buflen, z + 10);
                    ok = TRUE;
                }
            }
            else
            {
                /* relative notation - it's the zoneinfo key */
                safe_strcpy(buf, buflen, p);
                ok = TRUE;
            }

            /* that's our ZONE line, so we're done scanning the file */
            break;
        }

        /* done with the file */
        fclose(fp);

        /* if we got our result, return success */
        if (ok)
            return TRUE;
    }

    /* If /etc/localtime is a symbolic link, the linked file is the
     * actual zoneinfo file.  Resolve the link and return the portion
     * of the path after "/zoneinfo/".
     */
    static const char *elt = "/etc/localtime";
    unsigned long mode;
    char linkbuf[OSFNMAX];
    const char *zi;
    if (osfmode(elt, FALSE, &mode, NULL)
        && (mode & OSFMODE_LINK) != 0
        && os_resolve_symlink(elt, linkbuf, sizeof(linkbuf))
        && (zi = strstr(linkbuf, "/zoneinfo/")) != 0)
    {
        /* it's a link containing /zoneinfo/, so return the portion
         * after /zoneinfo/
         */
        safe_strcpy(buf, buflen, zi + 10);
        return TRUE;
    }

    /* well, we're out of ideas - return failure */
    return FALSE;
}